

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void * de::cmdline::detail::findNamedValueMatch
                 (char *src,void *namedValues,void *namedValuesEnd,size_t stride)

{
  void *pvVar1;
  bool bVar2;
  char *__rhs;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  void *local_68;
  void *curValue;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string srcStr;
  size_t stride_local;
  void *namedValuesEnd_local;
  void *namedValues_local;
  char *src_local;
  
  srcStr.field_2._8_8_ = stride;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,src,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_68 = namedValues;
  while( true ) {
    if (local_68 == namedValuesEnd) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_a8,"unrecognized value \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_88,&local_a8,"\'");
      std::invalid_argument::invalid_argument(this,(string *)&local_88);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    __rhs = getNamedValueName(local_68);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,__rhs);
    pvVar1 = local_68;
    if (bVar2) break;
    local_68 = (void *)((long)local_68 + srcStr.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_48);
  return pvVar1;
}

Assistant:

const void* findNamedValueMatch (const char* src, const void* namedValues, const void* namedValuesEnd, size_t stride)
{
	std::string srcStr(src);

	for (const void* curValue = namedValues; curValue != namedValuesEnd; curValue = (const void*)((deUintptr)curValue + stride))
	{
		if (srcStr == getNamedValueName(curValue))
			return curValue;
	}

	throw std::invalid_argument("unrecognized value '" + srcStr + "'");
}